

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOrder.c
# Opt level: O1

void Abc_NtkChangeCiOrder(Abc_Ntk_t *pNtk,Vec_Ptr_t *vSupp,int fReverse)

{
  void *pvVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  
  uVar5 = vSupp->nSize;
  if (uVar5 != pNtk->vCis->nSize) {
    __assert_fail("Vec_PtrSize(vSupp) == Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcOrder.c"
                  ,0x70,"void Abc_NtkChangeCiOrder(Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  if (fReverse == 0) {
    if (0 < (int)uVar5) {
      uVar6 = 0;
      do {
        if ((long)pNtk->vCis->nSize <= (long)uVar6) goto LAB_002dbb9f;
        pNtk->vCis->pArray[uVar6] = vSupp->pArray[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
  }
  else if (0 < (int)uVar5) {
    lVar2 = (ulong)uVar5 << 3;
    lVar7 = 0;
    do {
      uVar5 = uVar5 - 1;
      if ((lVar2 == lVar7) || (pNtk->vCis->nSize <= (int)uVar5)) {
LAB_002dbb9f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      pNtk->vCis->pArray[uVar5] = *(void **)((long)vSupp->pArray + lVar7);
      lVar7 = lVar7 + 8;
    } while (lVar2 != lVar7);
  }
  pNtk->vPis->nSize = 0;
  pVVar3 = pNtk->vCis;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar2];
      if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 2) {
        pVVar3 = pNtk->vPis;
        uVar5 = pVVar3->nCap;
        if (pVVar3->nSize == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar4;
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar5 * 2;
            if (iVar8 <= (int)uVar5) goto LAB_002dbb6b;
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar5 << 4);
            }
            pVVar3->pArray = ppvVar4;
          }
          pVVar3->nCap = iVar8;
        }
LAB_002dbb6b:
        iVar8 = pVVar3->nSize;
        pVVar3->nSize = iVar8 + 1;
        pVVar3->pArray[iVar8] = pvVar1;
      }
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vCis;
    } while (lVar2 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_NtkChangeCiOrder( Abc_Ntk_t * pNtk, Vec_Ptr_t * vSupp, int fReverse )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Vec_PtrSize(vSupp) == Abc_NtkCiNum(pNtk) );
    // order CIs using the array
    if ( fReverse )
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
            Vec_PtrWriteEntry( pNtk->vCis, Vec_PtrSize(vSupp)-1-i, pObj );
    else
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
            Vec_PtrWriteEntry( pNtk->vCis, i, pObj );
    // order PIs accordingly
    Vec_PtrClear( pNtk->vPis );
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjIsPi(pObj) )
            Vec_PtrPush( pNtk->vPis, pObj );
//    Abc_NtkForEachCi( pNtk, pObj, i )
//        printf( "%s ", Abc_ObjName(pObj) );
//    printf( "\n" );
}